

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_older(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  int32_t iVar2;
  int iVar3;
  
  iVar2 = get_child_list_count(node);
  iVar3 = -2;
  if ((((iVar2 == node->info->inner_num) &&
       (pmVar1 = node->child, pmVar1->info == (miniscript_item_t *)0x0)) && (pmVar1->kind == 8)) &&
     (0xffffffff80000000 < pmVar1->number - 0x80000000U)) {
    node->type_properties = node->info->type_properties;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int verify_miniscript_older(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    if ((get_child_list_count(node) != node->info->inner_num) || node->child->info ||
        (node->child->kind != DESCRIPTOR_KIND_NUMBER) ||
        (node->child->number <= 0) || (node->child->number > 0x7fffffff))
        return WALLY_EINVAL;

    node->type_properties = node->info->type_properties;
    return WALLY_OK;
}